

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
::clear_to_size(dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                *this,size_type new_num_buckets)

{
  pointer pSVar1;
  int32 iVar2;
  ShapeEdgeId *pSVar3;
  pointer pSVar4;
  ulong uVar5;
  float fVar6;
  
  if (this->table != (pointer)0x0) {
    if (this->num_buckets == new_num_buckets) goto LAB_001b4abe;
    operator_delete(this->table);
  }
  pSVar3 = __gnu_cxx::new_allocator<s2shapeutil::ShapeEdgeId>::allocate
                     ((new_allocator<s2shapeutil::ShapeEdgeId> *)&this->key_info,new_num_buckets,
                      (void *)0x0);
  this->table = pSVar3;
LAB_001b4abe:
  pSVar4 = this->table;
  if (pSVar4 != (pointer)0x0) {
    if (new_num_buckets != 0) {
      pSVar1 = pSVar4 + new_num_buckets;
      do {
        pSVar4->shape_id = -1;
        pSVar4->edge_id = -1;
        iVar2 = (this->key_info).empty.edge_id;
        pSVar4->shape_id = (this->key_info).empty.shape_id;
        pSVar4->edge_id = iVar2;
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar1);
    }
    this->num_deleted = 0;
    this->num_elements = 0;
    this->num_buckets = new_num_buckets;
    fVar6 = (this->settings).
            super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
            .enlarge_factor_ * (float)new_num_buckets;
    uVar5 = (ulong)fVar6;
    uVar5 = (long)(fVar6 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (new_num_buckets - 1 < uVar5) {
      uVar5 = new_num_buckets - 1;
    }
    (this->settings).
    super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
    .enlarge_threshold_ = uVar5;
    fVar6 = (float)new_num_buckets *
            (this->settings).
            super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
            .shrink_factor_;
    uVar5 = (ulong)fVar6;
    (this->settings).
    super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
    .shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    (this->settings).
    super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
    .consider_shrink_ = false;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                ,0x3cd,
                "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::clear_to_size(size_type) [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>]"
               );
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = get_internal_allocator().allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {   // resize, if necessary
        resize_table(num_buckets, new_num_buckets);
      }
    }
    assert(table);
    fill_range_with_empty(table, table + new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;          // our new size
    settings.reset_thresholds(bucket_count());
  }